

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

U16 __thiscall
ModbusSimulationDataGenerator::update_CRC(ModbusSimulationDataGenerator *this,U16 crc,U8 c)

{
  U16 short_c;
  U16 tmp;
  U8 c_local;
  U16 crc_local;
  ModbusSimulationDataGenerator *this_local;
  
  return crc >> 8 ^ this->crc_tab16[(int)((ushort)(crc ^ c) & 0xff)];
}

Assistant:

U16 ModbusSimulationDataGenerator::update_CRC( U16 crc, U8 c )
{
    U16 tmp, short_c;

    short_c = 0x00ff & ( U16 )c;

    // if ( ! crc_tab16_init ) init_crc16_tab();

    tmp = crc ^ short_c;
    crc = ( crc >> 8 ) ^ crc_tab16[ tmp & 0xff ];

    return crc;
}